

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_script.cpp
# Opt level: O2

RPCHelpMan * validateaddress(void)

{
  string name;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  Fallback fallback;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  string description_11;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  long lVar9;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  undefined4 in_stack_fffffffffffff1e8;
  undefined4 uVar10;
  undefined4 in_stack_fffffffffffff1ec;
  undefined8 in_stack_fffffffffffff1f0;
  undefined8 in_stack_fffffffffffff1f8;
  undefined8 in_stack_fffffffffffff200;
  _Manager_type in_stack_fffffffffffff208;
  undefined8 in_stack_fffffffffffff210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff218;
  pointer in_stack_fffffffffffff228;
  pointer pRVar11;
  pointer in_stack_fffffffffffff230;
  pointer pRVar12;
  pointer in_stack_fffffffffffff238;
  pointer pRVar13;
  _Vector_impl_data in_stack_fffffffffffff240;
  undefined1 in_stack_fffffffffffff258 [16];
  pointer in_stack_fffffffffffff268;
  pointer pRVar14;
  pointer in_stack_fffffffffffff270;
  pointer pRVar15;
  pointer in_stack_fffffffffffff278;
  pointer pRVar16;
  undefined8 in_stack_fffffffffffff280;
  pointer in_stack_fffffffffffff288;
  pointer pRVar17;
  pointer in_stack_fffffffffffff290;
  pointer pRVar18;
  pointer in_stack_fffffffffffff298;
  undefined8 in_stack_fffffffffffff2a0;
  pointer in_stack_fffffffffffff2a8;
  pointer in_stack_fffffffffffff2b0;
  pointer in_stack_fffffffffffff2b8;
  undefined8 in_stack_fffffffffffff2c0;
  pointer in_stack_fffffffffffff2c8;
  allocator<char> local_d1a;
  allocator<char> local_d19;
  vector<RPCResult,_std::allocator<RPCResult>_> local_d18;
  allocator<char> local_cfa;
  allocator<char> local_cf9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_cf8;
  allocator<char> local_cda;
  allocator<char> local_cd9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_cd8;
  allocator<char> local_cba;
  allocator<char> local_cb9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_cb8;
  allocator<char> local_c9a;
  allocator<char> local_c99;
  vector<RPCResult,_std::allocator<RPCResult>_> local_c98;
  allocator<char> local_c7a;
  allocator<char> local_c79;
  RPCResults local_c78;
  allocator_type local_c5b;
  allocator<char> local_c5a;
  allocator<char> local_c59;
  vector<RPCArg,_std::allocator<RPCArg>_> local_c58;
  allocator<char> local_c3a;
  allocator<char> local_c39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c18;
  string local_bf8;
  string local_bd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b98;
  string local_b78;
  string local_b58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b38;
  char *local_b18;
  size_type local_b10;
  char local_b08 [8];
  undefined8 uStack_b00;
  string local_af8 [32];
  string local_ad8 [32];
  RPCResult local_ab8;
  string local_a30 [32];
  string local_a10 [32];
  string local_9f0 [32];
  string local_9d0 [32];
  string local_9b0 [32];
  string local_990 [32];
  string local_970 [32];
  string local_950 [32];
  string local_930 [32];
  string local_910 [32];
  string local_8f0 [32];
  string local_8d0 [32];
  string local_8b0 [32];
  string local_890 [32];
  string local_870 [32];
  string local_850 [32];
  string local_830 [32];
  string local_810 [32];
  RPCResult local_7f0 [4];
  RPCResult local_5d0;
  RPCResult local_548;
  RPCResult local_4c0;
  RPCResult local_438;
  RPCResult local_3b0;
  string local_328 [32];
  string local_308 [32];
  RPCResult local_2e8;
  RPCArgOptions local_260;
  string local_218 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1f8;
  undefined1 local_1a0;
  string local_198 [32];
  RPCArg local_178;
  string local_70 [32];
  string local_50 [32];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"validateaddress",&local_c39);
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"\nReturn information about the given bitcoin address.\n",&local_c3a);
  std::__cxx11::string::string<std::allocator<char>>(local_198,"address",&local_c59);
  local_1f8._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_1a0 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_218,"The bitcoin address to validate",&local_c5a);
  local_260.oneline_description._M_dataplus._M_p = (pointer)&local_260.oneline_description.field_2;
  local_260.skip_type_check = false;
  local_260.oneline_description._M_string_length = 0;
  local_260.oneline_description.field_2._M_local_buf[0] = '\0';
  local_260.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_260.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_260.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_260.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_260._58_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff1ec;
  name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff1e8;
  name._M_string_length = in_stack_fffffffffffff1f0;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff1f8;
  name.field_2._8_8_ = in_stack_fffffffffffff200;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff210;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff208;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff218;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff228;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff230;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff238;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff240._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff240._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff240._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffff258;
  description_11._M_string_length = (size_type)in_stack_fffffffffffff270;
  description_11._M_dataplus._M_p = (pointer)in_stack_fffffffffffff268;
  description_11.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff278;
  description_11.field_2._8_8_ = in_stack_fffffffffffff280;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff290;
  opts._0_8_ = in_stack_fffffffffffff288;
  opts.oneline_description._M_string_length = (size_type)in_stack_fffffffffffff298;
  opts.oneline_description.field_2._M_allocated_capacity = in_stack_fffffffffffff2a0;
  opts.oneline_description.field_2._8_8_ = in_stack_fffffffffffff2a8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff2b0;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff2b8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff2c0;
  opts._64_8_ = in_stack_fffffffffffff2c8;
  RPCArg::RPCArg(&local_178,name,(Type)local_198,fallback,description_11,opts);
  __l._M_len = 1;
  __l._M_array = &local_178;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_c58,__l,&local_c5b);
  std::__cxx11::string::string<std::allocator<char>>(local_308,"",&local_c79);
  std::__cxx11::string::string<std::allocator<char>>(local_328,"",&local_c7a);
  std::__cxx11::string::string<std::allocator<char>>(local_810,"isvalid",&local_c99);
  std::__cxx11::string::string<std::allocator<char>>
            (local_830,"If the address is valid or not",&local_c9a);
  local_cb8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_cb8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_cb8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff1ec;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff1e8;
  m_key_name._M_string_length = in_stack_fffffffffffff1f0;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff1f8;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff200;
  description._M_string_length = in_stack_fffffffffffff210;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff208;
  description.field_2 = in_stack_fffffffffffff218;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff230;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff228;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff238;
  RPCResult::RPCResult(local_7f0,BOOL,m_key_name,description,inner,SUB81(local_810,0));
  std::__cxx11::string::string<std::allocator<char>>(local_850,"address",&local_cb9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_870,"The bitcoin address validated",&local_cba);
  local_cd8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_cd8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_cd8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar1._4_8_ = in_stack_fffffffffffff1f0;
  auVar1._0_4_ = in_stack_fffffffffffff1ec;
  auVar1._12_8_ = in_stack_fffffffffffff1f8;
  auVar1._20_8_ = in_stack_fffffffffffff200;
  auVar1._28_4_ = 0;
  description_00._M_string_length = in_stack_fffffffffffff210;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff208;
  description_00.field_2 = in_stack_fffffffffffff218;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff230;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff228;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff238;
  RPCResult::RPCResult
            (local_7f0 + 1,STR,(string)(auVar1 << 0x20),SUB81(local_850,0),description_00,inner_00,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_890,"scriptPubKey",&local_cd9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_8b0,"The hex-encoded output script generated by the address",&local_cda);
  local_cf8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_cf8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_cf8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar2._4_8_ = in_stack_fffffffffffff1f0;
  auVar2._0_4_ = in_stack_fffffffffffff1ec;
  auVar2._12_8_ = in_stack_fffffffffffff1f8;
  auVar2._20_8_ = in_stack_fffffffffffff200;
  auVar2._28_4_ = 0;
  description_01._M_string_length = in_stack_fffffffffffff210;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff208;
  description_01.field_2 = in_stack_fffffffffffff218;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff230;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff228;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff238;
  RPCResult::RPCResult
            (local_7f0 + 2,STR_HEX,(string)(auVar2 << 0x20),SUB81(local_890,0),description_01,
             inner_01,true);
  std::__cxx11::string::string<std::allocator<char>>(local_8d0,"isscript",&local_cf9);
  std::__cxx11::string::string<std::allocator<char>>(local_8f0,"If the key is a script",&local_cfa);
  local_d18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar3._4_8_ = in_stack_fffffffffffff1f0;
  auVar3._0_4_ = in_stack_fffffffffffff1ec;
  auVar3._12_8_ = in_stack_fffffffffffff1f8;
  auVar3._20_8_ = in_stack_fffffffffffff200;
  auVar3._28_4_ = 0;
  description_02._M_string_length = in_stack_fffffffffffff210;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff208;
  description_02.field_2 = in_stack_fffffffffffff218;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff230;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff228;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff238;
  RPCResult::RPCResult
            (local_7f0 + 3,BOOL,(string)(auVar3 << 0x20),SUB81(local_8d0,0),description_02,inner_02,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_910,"iswitness",&local_d19);
  std::__cxx11::string::string<std::allocator<char>>
            (local_930,"If the address is a witness address",&local_d1a);
  auVar4._4_8_ = in_stack_fffffffffffff1f0;
  auVar4._0_4_ = in_stack_fffffffffffff1ec;
  auVar4._12_8_ = in_stack_fffffffffffff1f8;
  auVar4._20_8_ = in_stack_fffffffffffff200;
  auVar4._28_4_ = 0;
  description_03._M_string_length = in_stack_fffffffffffff210;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff208;
  description_03.field_2 = in_stack_fffffffffffff218;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff230;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff228;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff238;
  RPCResult::RPCResult
            (&local_5d0,BOOL,(string)(auVar4 << 0x20),SUB81(local_910,0),description_03,inner_03,
             true);
  std::__cxx11::string::string<std::allocator<char>>
            (local_950,"witness_version",(allocator<char> *)&stack0xfffffffffffff2c7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_970,"The version number of the witness program",
             (allocator<char> *)&stack0xfffffffffffff2c6);
  auVar5._4_8_ = in_stack_fffffffffffff1f0;
  auVar5._0_4_ = in_stack_fffffffffffff1ec;
  auVar5._12_8_ = in_stack_fffffffffffff1f8;
  auVar5._20_8_ = in_stack_fffffffffffff200;
  auVar5._28_4_ = 0;
  description_04._M_string_length = in_stack_fffffffffffff210;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff208;
  description_04.field_2 = in_stack_fffffffffffff218;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff230;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff228;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff238;
  RPCResult::RPCResult
            (&local_548,NUM,(string)(auVar5 << 0x20),SUB81(local_950,0),description_04,inner_04,true
            );
  std::__cxx11::string::string<std::allocator<char>>
            (local_990,"witness_program",(allocator<char> *)&stack0xfffffffffffff2a7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_9b0,"The hex value of the witness program",
             (allocator<char> *)&stack0xfffffffffffff2a6);
  pRVar17 = (pointer)0x0;
  pRVar18 = (pointer)0x0;
  auVar6._4_8_ = in_stack_fffffffffffff1f0;
  auVar6._0_4_ = in_stack_fffffffffffff1ec;
  auVar6._12_8_ = in_stack_fffffffffffff1f8;
  auVar6._20_8_ = in_stack_fffffffffffff200;
  auVar6._28_4_ = 0;
  description_05._M_string_length = in_stack_fffffffffffff210;
  description_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff208;
  description_05.field_2 = in_stack_fffffffffffff218;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff230;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff228;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff238;
  RPCResult::RPCResult
            (&local_4c0,STR_HEX,(string)(auVar6 << 0x20),SUB81(local_990,0),description_05,inner_05,
             true);
  std::__cxx11::string::string<std::allocator<char>>
            (local_9d0,"error",(allocator<char> *)&stack0xfffffffffffff287);
  std::__cxx11::string::string<std::allocator<char>>
            (local_9f0,"Error message, if any",(allocator<char> *)&stack0xfffffffffffff286);
  pRVar14 = (pointer)0x0;
  pRVar15 = (pointer)0x0;
  pRVar16 = (pointer)0x0;
  uVar10 = 0;
  auVar7._4_8_ = in_stack_fffffffffffff1f0;
  auVar7._0_4_ = in_stack_fffffffffffff1ec;
  auVar7._12_8_ = in_stack_fffffffffffff1f8;
  auVar7._20_8_ = in_stack_fffffffffffff200;
  auVar7._28_4_ = 0;
  description_06._M_string_length = in_stack_fffffffffffff210;
  description_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff208;
  description_06.field_2 = in_stack_fffffffffffff218;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff230;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff228;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff238;
  RPCResult::RPCResult
            (&local_438,STR,(string)(auVar7 << 0x20),SUB81(local_9d0,0),description_06,inner_06,true
            );
  std::__cxx11::string::string<std::allocator<char>>
            (local_a10,"error_locations",(allocator<char> *)&stack0xfffffffffffff267);
  std::__cxx11::string::string<std::allocator<char>>
            (local_a30,"Indices of likely error locations in address, if known (e.g. Bech32 errors)"
             ,(allocator<char> *)&stack0xfffffffffffff266);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ad8,"index",(allocator<char> *)&stack0xfffffffffffff247);
  std::__cxx11::string::string<std::allocator<char>>
            (local_af8,"index of a potential error",(allocator<char> *)&stack0xfffffffffffff246);
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  pRVar13 = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff1ec;
  m_key_name_00._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_00._M_string_length = in_stack_fffffffffffff1f0;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff1f8;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff200;
  description_07._M_string_length = in_stack_fffffffffffff210;
  description_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffff208;
  description_07.field_2 = in_stack_fffffffffffff218;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_ab8,NUM,m_key_name_00,description_07,inner_07,SUB81(local_ad8,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_ab8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff248,__l_00,
             (allocator_type *)&stack0xfffffffffffff227);
  uVar10 = 0;
  auVar8._4_8_ = in_stack_fffffffffffff1f0;
  auVar8._0_4_ = in_stack_fffffffffffff1ec;
  auVar8._12_8_ = in_stack_fffffffffffff1f8;
  auVar8._20_8_ = in_stack_fffffffffffff200;
  auVar8._28_4_ = 0;
  description_08._M_string_length = in_stack_fffffffffffff210;
  description_08._M_dataplus._M_p = (pointer)in_stack_fffffffffffff208;
  description_08.field_2._M_local_buf = in_stack_fffffffffffff218._M_local_buf;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar12;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar11;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar13;
  RPCResult::RPCResult
            (&local_3b0,ARR,(string)(auVar8 << 0x20),SUB81(local_a10,0),description_08,inner_08,true
            );
  __l_01._M_len = 9;
  __l_01._M_array = local_7f0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_c98,__l_01,(allocator_type *)&stack0xfffffffffffff226);
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff1ec;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_01._M_string_length = in_stack_fffffffffffff1f0;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff1f8;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff200;
  description_09._M_string_length = in_stack_fffffffffffff210;
  description_09._M_dataplus._M_p = (pointer)in_stack_fffffffffffff208;
  description_09.field_2 = in_stack_fffffffffffff218;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar12;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar11;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar13;
  RPCResult::RPCResult(&local_2e8,OBJ,m_key_name_01,description_09,inner_09,SUB81(local_308,0));
  result._4_4_ = in_stack_fffffffffffff1ec;
  result.m_type = uVar10;
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1f0;
  result.m_key_name._M_string_length = in_stack_fffffffffffff1f8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff200;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff208;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff210;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff218;
  result._64_8_ = pRVar11;
  result.m_description._M_dataplus._M_p = (pointer)pRVar12;
  result.m_description._M_string_length = (size_type)pRVar13;
  result._88_24_ = in_stack_fffffffffffff240;
  result.m_cond._8_16_ = in_stack_fffffffffffff258;
  result.m_cond.field_2._8_8_ = pRVar14;
  RPCResults::RPCResults(&local_c78,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b78,"validateaddress",(allocator<char> *)&stack0xfffffffffffff225);
  std::operator+(&local_bb8,"\"",EXAMPLE_ADDRESS_abi_cxx11_);
  std::operator+(&local_b98,&local_bb8,"\"");
  HelpExampleCli(&local_b58,&local_b78,&local_b98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bf8,"validateaddress",(allocator<char> *)&stack0xfffffffffffff224);
  std::operator+(&local_c38,"\"",EXAMPLE_ADDRESS_abi_cxx11_);
  std::operator+(&local_c18,&local_c38,"\"");
  HelpExampleRpc(&local_bd8,&local_bf8,&local_c18);
  std::operator+(&local_b38,&local_b58,&local_bd8);
  local_b18 = local_b08;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b38._M_dataplus._M_p == &local_b38.field_2) {
    uStack_b00 = local_b38.field_2._8_8_;
  }
  else {
    local_b18 = local_b38._M_dataplus._M_p;
  }
  local_b10 = local_b38._M_string_length;
  local_b38._M_string_length = 0;
  local_b38.field_2._M_local_buf[0] = '\0';
  description_10._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/output_script.cpp:57:9)>
       ::_M_invoke;
  description_10._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/output_script.cpp:57:9)>
                ::_M_manager;
  description_10.field_2 = in_stack_fffffffffffff218;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar12;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar11;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar13;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar14;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_fffffffffffff258._0_8_;
  examples.m_examples._M_string_length = in_stack_fffffffffffff258._8_8_;
  examples.m_examples.field_2._8_8_ = pRVar15;
  fun.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffff280;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar16;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar17;
  fun._M_invoker = (_Invoker_type)pRVar18;
  local_b38._M_dataplus._M_p = (pointer)&local_b38.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffff1f0,&stack0xfffffffffffff1f8)),
             description_10,args,(RPCResults)in_stack_fffffffffffff240,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff1f8);
  std::__cxx11::string::~string((string *)&local_b18);
  std::__cxx11::string::~string((string *)&local_b38);
  std::__cxx11::string::~string((string *)&local_bd8);
  std::__cxx11::string::~string((string *)&local_c18);
  std::__cxx11::string::~string((string *)&local_c38);
  std::__cxx11::string::~string((string *)&local_bf8);
  std::__cxx11::string::~string((string *)&local_b58);
  std::__cxx11::string::~string((string *)&local_b98);
  std::__cxx11::string::~string((string *)&local_bb8);
  std::__cxx11::string::~string((string *)&local_b78);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_c78.m_results);
  RPCResult::~RPCResult(&local_2e8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_c98);
  lVar9 = 0x440;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_7f0[0].m_type + lVar9));
    lVar9 = lVar9 + -0x88;
  } while (lVar9 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff248);
  RPCResult::~RPCResult(&local_ab8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff228);
  std::__cxx11::string::~string(local_af8);
  std::__cxx11::string::~string(local_ad8);
  std::__cxx11::string::~string(local_a30);
  std::__cxx11::string::~string(local_a10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff268);
  std::__cxx11::string::~string(local_9f0);
  std::__cxx11::string::~string(local_9d0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff288);
  std::__cxx11::string::~string(local_9b0);
  std::__cxx11::string::~string(local_990);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff2a8);
  std::__cxx11::string::~string(local_970);
  std::__cxx11::string::~string(local_950);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff2c8);
  std::__cxx11::string::~string(local_930);
  std::__cxx11::string::~string(local_910);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_d18);
  std::__cxx11::string::~string(local_8f0);
  std::__cxx11::string::~string(local_8d0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_cf8);
  std::__cxx11::string::~string(local_8b0);
  std::__cxx11::string::~string(local_890);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_cd8);
  std::__cxx11::string::~string(local_870);
  std::__cxx11::string::~string(local_850);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_cb8);
  std::__cxx11::string::~string(local_830);
  std::__cxx11::string::~string(local_810);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string(local_308);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_c58);
  RPCArg::~RPCArg(&local_178);
  RPCArgOptions::~RPCArgOptions(&local_260);
  std::__cxx11::string::~string(local_218);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_1f8._M_first);
  std::__cxx11::string::~string(local_198);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan validateaddress()
{
    return RPCHelpMan{
        "validateaddress",
        "\nReturn information about the given bitcoin address.\n",
        {
            {"address", RPCArg::Type::STR, RPCArg::Optional::NO, "The bitcoin address to validate"},
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::BOOL, "isvalid", "If the address is valid or not"},
                {RPCResult::Type::STR, "address", /*optional=*/true, "The bitcoin address validated"},
                {RPCResult::Type::STR_HEX, "scriptPubKey", /*optional=*/true, "The hex-encoded output script generated by the address"},
                {RPCResult::Type::BOOL, "isscript", /*optional=*/true, "If the key is a script"},
                {RPCResult::Type::BOOL, "iswitness", /*optional=*/true, "If the address is a witness address"},
                {RPCResult::Type::NUM, "witness_version", /*optional=*/true, "The version number of the witness program"},
                {RPCResult::Type::STR_HEX, "witness_program", /*optional=*/true, "The hex value of the witness program"},
                {RPCResult::Type::STR, "error", /*optional=*/true, "Error message, if any"},
                {RPCResult::Type::ARR, "error_locations", /*optional=*/true, "Indices of likely error locations in address, if known (e.g. Bech32 errors)",
                    {
                        {RPCResult::Type::NUM, "index", "index of a potential error"},
                    }},
            }
        },
        RPCExamples{
            HelpExampleCli("validateaddress", "\"" + EXAMPLE_ADDRESS[0] + "\"") +
            HelpExampleRpc("validateaddress", "\"" + EXAMPLE_ADDRESS[0] + "\"")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            std::string error_msg;
            std::vector<int> error_locations;
            CTxDestination dest = DecodeDestination(request.params[0].get_str(), error_msg, &error_locations);
            const bool isValid = IsValidDestination(dest);
            CHECK_NONFATAL(isValid == error_msg.empty());

            UniValue ret(UniValue::VOBJ);
            ret.pushKV("isvalid", isValid);
            if (isValid) {
                std::string currentAddress = EncodeDestination(dest);
                ret.pushKV("address", currentAddress);

                CScript scriptPubKey = GetScriptForDestination(dest);
                ret.pushKV("scriptPubKey", HexStr(scriptPubKey));

                UniValue detail = DescribeAddress(dest);
                ret.pushKVs(std::move(detail));
            } else {
                UniValue error_indices(UniValue::VARR);
                for (int i : error_locations) error_indices.push_back(i);
                ret.pushKV("error_locations", std::move(error_indices));
                ret.pushKV("error", error_msg);
            }

            return ret;
        },
    };
}